

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O1

int write_sparse_data_chunk(output_file *out,uint len,void *data)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  chunk_header_t chunk_header;
  undefined4 local_3c;
  uint local_38;
  int local_34;
  
  uVar1 = out->block_size;
  uVar5 = (len + uVar1) - 1;
  local_38 = uVar5 / uVar1;
  uVar5 = uVar5 - uVar5 % uVar1;
  local_3c = 0xcac1;
  local_34 = uVar5 + 0xc;
  iVar2 = (*out->ops->write)(out,&local_3c,0xc);
  iVar3 = -1;
  if ((-1 < iVar2) && (iVar2 = (*out->ops->write)(out,data,(ulong)len), -1 < iVar2)) {
    iVar2 = uVar5 - len;
    if ((iVar2 != 0) && (iVar3 = (*out->ops->write)(out,out->zero_buf,(long)iVar2), iVar3 < 0)) {
      return -1;
    }
    if (out->use_crc != 0) {
      uVar4 = sparse_crc32(out->crc32,data,(ulong)len);
      out->crc32 = uVar4;
      if (uVar5 != len) {
        uVar4 = sparse_crc32(uVar4,out->zero_buf,(long)iVar2);
        out->crc32 = uVar4;
      }
    }
    out->cur_out_ptr = out->cur_out_ptr + (long)(int)uVar5;
    out->chunk_cnt = out->chunk_cnt + 1;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int write_sparse_data_chunk(struct output_file* out, unsigned int len, void* data) {
  chunk_header_t chunk_header;
  int rnd_up_len, zero_len;
  int ret;

  /* Round up the data length to a multiple of the block size */
  rnd_up_len = ALIGN(len, out->block_size);
  zero_len = rnd_up_len - len;

  /* Finally we can safely emit a chunk of data */
  chunk_header.chunk_type = CHUNK_TYPE_RAW;
  chunk_header.reserved1 = 0;
  chunk_header.chunk_sz = rnd_up_len / out->block_size;
  chunk_header.total_sz = CHUNK_HEADER_LEN + rnd_up_len;
  ret = out->ops->write(out, &chunk_header, sizeof(chunk_header));

  if (ret < 0) return -1;
  ret = out->ops->write(out, data, len);
  if (ret < 0) return -1;
  if (zero_len) {
    ret = out->ops->write(out, out->zero_buf, zero_len);
    if (ret < 0) return -1;
  }

  if (out->use_crc) {
    out->crc32 = sparse_crc32(out->crc32, data, len);
    if (zero_len) out->crc32 = sparse_crc32(out->crc32, out->zero_buf, zero_len);
  }

  out->cur_out_ptr += rnd_up_len;
  out->chunk_cnt++;

  return 0;
}